

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  ImVector<ImGuiTabItem> *in_RDI;
  ImGuiTabItem *tab;
  int tab_n;
  ImGuiTabItem *most_recently_selected_tab;
  int local_14;
  ImGuiTabItem *local_10;
  
  local_10 = (ImGuiTabItem *)0x0;
  for (local_14 = 0; local_14 < in_RDI->Size; local_14 = local_14 + 1) {
    pIVar1 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_14);
    if ((((local_10 == (ImGuiTabItem *)0x0) ||
         (local_10->LastFrameSelected < pIVar1->LastFrameSelected)) &&
        (pIVar1->Window != (ImGuiWindow *)0x0)) && ((pIVar1->Window->WasActive & 1U) != 0)) {
      local_10 = pIVar1;
    }
  }
  return local_10;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* most_recently_selected_tab = NULL;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            if (tab->Window && tab->Window->WasActive)
                most_recently_selected_tab = tab;
    }
    return most_recently_selected_tab;
}